

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzerSettings.cpp
# Opt level: O2

void __thiscall ModbusAnalyzerSettings::ModbusAnalyzerSettings(ModbusAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_01;
  auto_ptr<AnalyzerSettingInterfaceInteger> *this_02;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_03;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_04;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_05;
  AnalyzerSettingInterfaceNumberList *pAVar1;
  AnalyzerSettingInterfaceChannel *this_06;
  AnalyzerSettingInterfaceInteger *this_07;
  char *pcVar2;
  Channel *pCVar3;
  ulong uVar4;
  uint uVar5;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__ModbusAnalyzerSettings_00120d70;
  this_00 = &this->mInputChannel;
  uVar4 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mParity = EvenOne;
  this->mInverted = false;
  this->mUseAutobaud = false;
  this_01 = &this->mInputChannelInterface;
  this_02 = &this->mBitRateInterface;
  this_03 = &this->mParityInterface;
  this_04 = &this->mInvertedInterface;
  this_05 = &this->mModbusModeInterface;
  *(undefined8 *)&this->mModbusMode = 0;
  *(undefined8 *)((long)&(this->mInputChannelInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mBitRateInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mBitsPerTransferInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mShiftOrderInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mParityInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mInvertedInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mUseAutobaudInterface)._M_ptr + 4) = 0;
  *(undefined4 *)((long)&(this->mModbusModeInterface)._M_ptr + 4) = 0;
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_03,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03->_M_ptr,"Parity Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_03->_M_ptr,"Even Parity Bit (default)");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_03->_M_ptr,"Odd Parity Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_03->_M_ptr,"No Parity Bit, 2 stop bits");
  pcVar2 = "No Parity Bit, 1 stop bit";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)this_03->_M_ptr,"No Parity Bit, 1 stop bit");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mParity);
  this_06 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar2);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_06);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_01,this_06);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01->_M_ptr,"Modbus");
  pCVar3 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01->_M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar3);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_05,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_05->_M_ptr,"Modbus Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_05->_M_ptr,"RTU - Client");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_05->_M_ptr,"RTU - Server");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_05->_M_ptr,"ASCII - Client");
  pcVar2 = "ASCII - Server";
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)this_05->_M_ptr,"ASCII - Server");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mModbusMode);
  this_07 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar2);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_07);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(this_02,this_07);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02->_M_ptr,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax((int)this_02->_M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)this_02->_M_ptr);
  uVar4 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_04,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_04->_M_ptr,"Signal Inversion");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_04->_M_ptr,"Non Inverted (Standard)");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_04->_M_ptr,"Inverted");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mInverted);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

ModbusAnalyzerSettings::ModbusAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 9600 ),
      mBitsPerTransfer( 8 ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mParity( ModbusAnalyzerEnums::ParityAndStopbits::EvenOne ),
      mInverted( false ),
      mUseAutobaud( false ),
      mModbusMode( ModbusAnalyzerEnums::ModbusRTUClient )
{
    mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mParityInterface->SetTitleAndTooltip( "Parity Bit", "Specify None, Even, or Odd Parity" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::EvenOne, "Even Parity Bit (default)", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::OddOne, "Odd Parity Bit", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::NoneTwo, "No Parity Bit, 2 stop bits", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::NoneOne, "No Parity Bit, 1 stop bit", "" );
    mParityInterface->SetNumber( mParity );


    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Modbus",
                                                "Modbus" ); // Todo: Change to reflect specific variant of Modbus later in program.
    mInputChannelInterface->SetChannel( mInputChannel );


    mModbusModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mModbusModeInterface->SetTitleAndTooltip( "Modbus Mode", "Specify which mode of Modbus this is" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusRTUClient, "RTU - Client", "Messages are transmitted in binary" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusRTUServer, "RTU - Server", "Messages are transmitted in binary" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusASCIIClient, "ASCII - Client",
                                     "Messages are transmitted in ASCII-readable format" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusASCIIServer, "ASCII - Server",
                                     "Messages are transmitted in ASCII-readable format" );
    mModbusModeInterface->SetNumber( mModbusMode );


    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "" );
    mBitRateInterface->SetMax( 6000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );


    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Signal Inversion", "Specify if the serial signal is inverted" );
    mInvertedInterface->AddNumber( false, "Non Inverted (Standard)", "" );
    mInvertedInterface->AddNumber( true, "Inverted", "" );
    mInvertedInterface->SetNumber( mInverted );
    enum Mode
    {
        Normal,
        MpModeRightZeroMeansAddress,
        MpModeRightOneMeansAddress,
        MpModeLeftZeroMeansAddress,
        MpModeLeftOneMeansAddress
    }; // FIXME: unused?


    AddInterface( mInputChannelInterface.get() );
    AddInterface( mModbusModeInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mParityInterface.get() );


    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Modbus", false );
}